

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_views.cpp
# Opt level: O3

void populate_container(char_array_list *data,size_t element_count)

{
  buffer_t<char> *this;
  memory_resource *pmVar1;
  ulong uVar2;
  ulong uVar3;
  short *psVar4;
  long lVar5;
  undefined8 unaff_R12;
  ulong uVar6;
  ulong uVar7;
  char *new_buffer;
  size_t new_buffer_size;
  char *local_88;
  size_t local_80;
  size_t local_78;
  sizes_t local_70;
  char_array_list *local_50;
  undefined1 *local_48;
  size_t *local_40;
  undefined1 local_38;
  
  local_78 = element_count;
  if (element_count != 0) {
    this = &(data->buffer_).v2_;
    uVar6 = CONCAT62((int6)((ulong)unaff_R12 >> 0x10),1);
    uVar7 = 0;
    do {
      iffl::buffer_t<char>::validate(this);
      local_88 = (char *)0x0;
      local_80 = 0;
      local_40 = &local_80;
      local_38 = 1;
      local_50 = data;
      local_48 = (undefined1 *)&local_88;
      iffl::
      flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
      ::get_all_sizes(&local_70,data);
      uVar3 = local_70.last_element.super_range.data_end + 1 & 0xfffffffffffffffe;
      uVar2 = local_70.total_capacity - uVar3;
      if (local_70.total_capacity < uVar3) {
        uVar2 = 0;
      }
      lVar5 = (uVar7 + 2) - uVar2;
      if (uVar7 + 2 < uVar2 || lVar5 == 0) {
        psVar4 = (short *)(this->begin + uVar3);
      }
      else {
        local_80 = lVar5 + (local_70.total_capacity + 1 & 0xfffffffffffffffe);
        pmVar1 = (data->buffer_).v1_._M_resource;
        local_88 = (char *)(**(code **)(*(long *)pmVar1 + 0x10))(pmVar1,local_80,1);
        psVar4 = (short *)(local_88 +
                          (local_70.last_element.super_range.data_end + 1 & 0xfffffffffffffffe));
      }
      *psVar4 = (short)uVar6 + -1;
      if ((short)uVar6 != 1) {
        memset(psVar4 + 1,(int)uVar6,(long)psVar4 + (uVar7 - (long)(psVar4 + 1)) + 2);
      }
      if (local_88 != (char *)0x0) {
        if (this->begin != (pointer_type)0x0) {
          memcpy(local_88,this->begin,local_70.last_element.super_range.data_end);
        }
        iffl::
        flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
        ::commit_new_buffer(data,&local_88,&local_80);
      }
      (data->buffer_).v2_.last = (pointer_type)psVar4;
      iffl::buffer_t<char>::validate(this);
      iffl::
      flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
      ::validate_data_invariants(data);
      if (local_88 != (char *)0x0) {
        iffl::
        flat_forward_list<pod_array_list_entry<char>,_iffl::flat_forward_list_traits<pod_array_list_entry<char>_>,_std::pmr::polymorphic_allocator<char>_>
        ::deallocate_buffer(data,local_88,local_80);
      }
      uVar7 = uVar6 & 0xffff;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (uVar7 < local_78);
  }
  printf("Created collection with %zu elements\n",local_78);
  return;
}

Assistant:

void populate_container(char_array_list &data, size_t element_count) noexcept {
    for (unsigned short idx = 0; idx < element_count; ++idx) {
        size_t element_size{ char_array_list::traits::minimum_size() + idx * sizeof(char_array_list::value_type::type) };
        data.emplace_back(element_size,
                          [&idx] (char_array_list_entry &e,
                                  size_t element_size) noexcept {
                              e.length = idx;
                              std::fill(e.arr, e.arr + e.length, static_cast<char>(idx)+1);
                          });
    }
    std::printf("Created collection with %zu elements\n", element_count);
}